

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O1

void spell_concave_shell(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  EXIT_DATA *pEVar1;
  bool bVar2;
  long lVar3;
  char *txt;
  CHAR_DATA *ch_local;
  int *dirptr;
  string local_58;
  string local_38;
  
  dirptr = (int *)0x0;
  ch_local = ch;
  bVar2 = str_cmp(target_name,"n");
  lVar3 = 0;
  if (bVar2) {
    bVar2 = str_cmp(target_name,"north");
    if (bVar2) {
      bVar2 = str_cmp(target_name,"e");
      lVar3 = 1;
      if (bVar2) {
        bVar2 = str_cmp(target_name,"east");
        if (bVar2) {
          bVar2 = str_cmp(target_name,"s");
          lVar3 = 2;
          if (bVar2) {
            bVar2 = str_cmp(target_name,"south");
            if (bVar2) {
              bVar2 = str_cmp(target_name,"w");
              lVar3 = 3;
              if (bVar2) {
                bVar2 = str_cmp(target_name,"west");
                if (bVar2) {
                  bVar2 = str_cmp(target_name,"u");
                  lVar3 = 4;
                  if (bVar2) {
                    bVar2 = str_cmp(target_name,"up");
                    if (bVar2) {
                      bVar2 = str_cmp(target_name,"d");
                      lVar3 = 5;
                      if (bVar2) {
                        bVar2 = str_cmp(target_name,"down");
                        if (bVar2) {
                          txt = "In which direction?\n\r";
                          goto LAB_00317d21;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pEVar1 = ch_local->in_room->exit[lVar3];
  if ((pEVar1 != (EXIT_DATA *)0x0) && ((pEVar1->u1).to_room != (ROOM_INDEX_DATA *)0x0)) {
    if ((pEVar1->exit_info[0] & 2) != 0) {
      bVar2 = is_affected_by(ch_local,0x14);
      if (!bVar2) goto LAB_00317d16;
    }
    if ((~(uint)pEVar1->exit_info[0] & 0x12) != 0) {
      ch_local->disrupted = false;
      dirptr = (int *)talloc_struct(4);
      *dirptr = (int)lVar3;
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"spell_concave_shell","");
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"concave_shell_move","");
      CQueue::
      AddToQueue<void(*)(char_data*,int*,room_index_data*),char_data*&,int*&,room_index_data*&>
                (&RS.Queue,6,&local_38,&local_58,concave_shell_move,&ch_local,&dirptr,
                 &ch_local->in_room);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      act("Air begins to swirl rapidly around you.",ch_local,(void *)0x0,(void *)0x0,3);
      act("Swirling winds begin to mass near $n.",ch_local,(void *)0x0,(void *)0x0,0);
      return;
    }
  }
LAB_00317d16:
  txt = "That direction is obstructed!\n\r";
LAB_00317d21:
  send_to_char(txt,ch_local);
  return;
}

Assistant:

void spell_concave_shell(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	EXIT_DATA *pexit;
	int dir;
	int *dirptr = nullptr;

	if (!str_cmp(target_name, "n") || !str_cmp(target_name, "north"))
	{
		dir = Directions::North;
	}
	else if (!str_cmp(target_name, "e") || !str_cmp(target_name, "east"))
	{
		dir = Directions::East;
	}
	else if (!str_cmp(target_name, "s") || !str_cmp(target_name, "south"))
	{
		dir = Directions::South;
	}
	else if (!str_cmp(target_name, "w") || !str_cmp(target_name, "west"))
	{
		dir = Directions::West;
	}
	else if (!str_cmp(target_name, "u") || !str_cmp(target_name, "up"))
	{
		dir = Directions::Up;
	}
	else if (!str_cmp(target_name, "d") || !str_cmp(target_name, "down"))
	{
		dir = Directions::Down;
	}
	else
	{
		send_to_char("In which direction?\n\r", ch);
		return;
	}

	pexit = ch->in_room->exit[dir];

	if (pexit == nullptr
		|| pexit->u1.to_room == nullptr
		|| (IS_SET(pexit->exit_info, EX_CLOSED) && !is_affected_by(ch, AFF_PASS_DOOR))
		|| (IS_SET(pexit->exit_info, EX_CLOSED) && IS_SET(pexit->exit_info, EX_NOPASS)))
	{
		send_to_char("That direction is obstructed!\n\r", ch);
		return;
	}

	ch->disrupted = false;

	dirptr = (int *)talloc_struct(sizeof(int));
	*dirptr = dir;

	RS.Queue.AddToQueue(6, "spell_concave_shell", "concave_shell_move", concave_shell_move, ch, dirptr, ch->in_room);

	act("Air begins to swirl rapidly around you.", ch, 0, 0, TO_CHAR);
	act("Swirling winds begin to mass near $n.", ch, 0, 0, TO_ROOM);
}